

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonutils.cpp
# Opt level: O0

colvec * colvec_from_json(json *json_node)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *x;
  colvec *in_RDI;
  vector<double,_std::allocator<double>_> raw_data;
  string data;
  string base64_data;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined1 remove_linebreaks;
  string *in_stack_ffffffffffffff58;
  Col<double> *this;
  char *in_stack_ffffffffffffff68;
  const_reference in_stack_ffffffffffffff70;
  pointer in_stack_ffffffffffffff98;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_ffffffffffffffa0;
  uint8_t *in_stack_ffffffffffffffa8;
  undefined1 local_50 [80];
  
  remove_linebreaks = (undefined1)((ulong)in_stack_ffffffffffffff50 >> 0x38);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  bVar1 = nlohmann::json_abi_v3_11_3::operator==<const_char_*,_0>
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (!bVar1) {
    __assert_fail("json_node[\"type\"] == \"colvec\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/src/lib/utils/jsonutils.cpp"
                  ,0x5e,"arma::colvec colvec_from_json(const nlohmann::json &)");
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::
  operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (in_stack_ffffffffffffff48);
  base64_decode(in_stack_ffffffffffffff58,(bool)remove_linebreaks);
  this = (Col<double> *)local_50;
  std::__cxx11::string::data();
  std::__cxx11::string::size();
  deserialize<double>(in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
  std::vector<double,_std::allocator<double>_>::size
            ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff88);
  x = (vector<double,_std::allocator<double>_> *)
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::operator[]<char_const>(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  bVar1 = nlohmann::json_abi_v3_11_3::operator==<unsigned_long,_0>
                    ((unsigned_long)this,(const_reference)x);
  if (!bVar1) {
    __assert_fail("raw_data.size() == json_node[\"size\"]",
                  "/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/src/lib/utils/jsonutils.cpp"
                  ,0x62,"arma::colvec colvec_from_json(const nlohmann::json &)");
  }
  arma::Col<double>::Col(this,x);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 0x20));
  return in_RDI;
}

Assistant:

LIBKRIGING_EXPORT arma::colvec colvec_from_json(const nlohmann::json& json_node) {
  assert(json_node["type"] == "colvec");
  std::string base64_data = json_node["base64_data"];
  const std::string data = base64_decode(base64_data);
  std::vector<double> raw_data = deserialize<double>(reinterpret_cast<const uint8_t*>(data.data()), data.size());
  assert(raw_data.size() == json_node["size"]);
  return {raw_data};
}